

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

void M3x3_ExtractEulerAngles_ZXY(double (*matrix) [3],double *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (((*matrix)[0] != 9999999.0) || (NAN((*matrix)[0]))) {
    dVar3 = (*matrix)[1] * (*matrix)[1] + matrix[1][1] * matrix[1][1];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar2 = atan2(matrix[2][1],dVar3);
    if (0.0001 <= dVar3) {
      dVar3 = atan2(-matrix[2][0],matrix[2][2]);
      dVar1 = atan2(-(*matrix)[1],matrix[1][1]);
      dVar1 = dVar1 * 57.29577951308232;
    }
    else {
      dVar3 = atan2((*matrix)[2],(*matrix)[0]);
      dVar1 = 0.0;
    }
    *angles = dVar2 * 57.29577951308232;
    dVar3 = dVar3 * 57.29577951308232;
  }
  else {
    *angles = 9999999.0;
    dVar3 = 9999999.0;
    dVar1 = 9999999.0;
  }
  angles[1] = dVar3;
  angles[2] = dVar1;
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_ZXY(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosX;

/*
   R[ZXY] = Rz * Rx * Ry

            | cz   -sz   0 |   | 1    0    0 |   | cy   0   sy |
          = | sz    cz   0 | * | 0   cx  -sx | * |  0   1    0 |
            |  0     0   1 |   | 0   sx   cx |   |-sy   0   cy |


            | cycz - sxsysz    -cxsz    sycz + sxcysz |
          = | cysz + sxsycz     cxcz    sysz - sxcycz |
            |-cxsy              sx      cxcy          |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosX = sqrt(matrix[0][1]*matrix[0][1] + matrix[1][1]*matrix[1][1]);

    ax = atan2(matrix[2][1], cosX);

    if (cosX < 0.0001)
    {
     // Gimble lock: set first angle to zero.
     // Assume sx=+-1,cx=0,sz=0,cz=1.0 and decode the matrix accordingly

        ay = atan2(matrix[0][2], matrix[0][0]);
        az = 0.0;
    }
    else
    {
        ay = atan2(-matrix[2][0], matrix[2][2]);
        az = atan2(-matrix[0][1], matrix[1][1]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}